

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_read_ns(BitReadCtx_t *gbc,char *name,RK_U32 n,RK_U32 *write_to)

{
  RK_S32 RVar1;
  MPP_RET MVar2;
  int local_4c;
  RK_U32 local_48;
  RK_S32 _out_1;
  RK_S32 _out;
  RK_S32 w;
  RK_U32 value;
  RK_U32 extra_bit;
  RK_U32 v;
  RK_U32 m;
  RK_U32 *write_to_local;
  char *pcStack_20;
  RK_U32 n_local;
  char *name_local;
  BitReadCtx_t *gbc_local;
  
  _v = write_to;
  write_to_local._4_4_ = n;
  pcStack_20 = name;
  name_local = (char *)gbc;
  RVar1 = mpp_log2(n);
  _out_1 = RVar1 + 1;
  extra_bit = (1 << ((byte)_out_1 & 0x1f)) - write_to_local._4_4_;
  RVar1 = mpp_get_bits_left((BitReadCtx_t *)name_local);
  if (RVar1 < _out_1) {
    _mpp_log_l(2,"av1d_cbs","Invalid non-symmetric value at %s: bitstream ended.\n",
               "mpp_av1_read_ns",pcStack_20);
    return -1;
  }
  if (_out_1 + -1 < 1) {
    value = 0;
LAB_0021923c:
    if (value < extra_bit) {
      _out = value;
    }
    else {
      MVar2 = mpp_read_bits((BitReadCtx_t *)name_local,1,&local_4c);
      *(MPP_RET *)(name_local + 0x44) = MVar2;
      if (*(int *)(name_local + 0x44) != 0) goto LAB_0021929f;
      _out = (value * 2 - extra_bit) + local_4c;
    }
    *_v = _out;
    gbc_local._4_4_ = 0;
  }
  else {
    MVar2 = mpp_read_bits((BitReadCtx_t *)name_local,_out_1 + -1,(RK_S32 *)&local_48);
    *(MPP_RET *)(name_local + 0x44) = MVar2;
    if (*(int *)(name_local + 0x44) == 0) {
      value = local_48;
      goto LAB_0021923c;
    }
LAB_0021929f:
    gbc_local._4_4_ = -1;
  }
  return gbc_local._4_4_;
}

Assistant:

static RK_S32 mpp_av1_read_ns(BitReadCtx_t *gbc, const char *name,
                              RK_U32 n, RK_U32 *write_to)
{
    RK_U32 m, v, extra_bit, value;
    RK_S32 w;

    w = mpp_log2(n) + 1;
    m = (1 << w) - n;

    if (mpp_get_bits_left(gbc) < w) {
        mpp_err_f("Invalid non-symmetric value at "
                  "%s: bitstream ended.\n", name);
        return MPP_NOK;
    }
    if (w - 1 > 0)
        READ_BITS(gbc, w - 1, &v);
    else
        v = 0;

    if (v < m) {
        value = v;
    } else {
        READ_ONEBIT(gbc, &extra_bit);
        value = (v << 1) - m + extra_bit;
    }

    *write_to = value;
    return MPP_OK;

__bitread_error:
    return MPP_NOK;

}